

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L;
  StkId key;
  TString *key_00;
  TValue *slot;
  TString *x_;
  
  L = ls->L;
  key_00 = luaS_newlstr(L,str,l);
  slot = luaH_getstr(ls->h,key_00);
  if ((slot->tt_ & 0xf) == 0) {
    key = (L->top).p;
    (L->top).p = key + 1;
    *(TString **)key = key_00;
    (key->val).tt_ = key_00->tt | 0x40;
    luaH_finishset(L,ls->h,&key->val,slot,(TValue *)key);
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  else {
    key_00 = (TString *)slot[1].value_.gc;
  }
  return key_00;
}

Assistant:

TString *luaX_newstring (LexState *ls, const char *str, size_t l) {
  lua_State *L = ls->L;
  TString *ts = luaS_newlstr(L, str, l);  /* create new string */
  const TValue *o = luaH_getstr(ls->h, ts);
  if (!ttisnil(o))  /* string already present? */
    ts = keystrval(nodefromval(o));  /* get saved copy */
  else {  /* not in use yet */
    TValue *stv = s2v(L->top.p++);  /* reserve stack space for string */
    setsvalue(L, stv, ts);  /* temporarily anchor the string */
    luaH_finishset(L, ls->h, stv, o, stv);  /* t[string] = string */
    /* table is not a metatable, so it does not need to invalidate cache */
    luaC_checkGC(L);
    L->top.p--;  /* remove string from stack */
  }
  return ts;
}